

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

time_t curl_getdate(char *p,time_t *now)

{
  int iVar1;
  time_t parsed;
  ulong local_10;
  
  local_10 = 0xffffffffffffffff;
  iVar1 = parsedate(p,(time_t *)&local_10);
  if (local_10 == 0xffffffffffffffff) {
    local_10 = 0;
  }
  return -(ulong)(iVar1 != 0) | local_10;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  if(rc == PARSEDATE_OK) {
    if(parsed == -1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  }
  /* everything else is fail */
  return -1;
}